

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GrowingArray.h
# Opt level: O0

void __thiscall
JsUtil::GrowingArray<Wasm::WasmTypes::WasmType,_Memory::ArenaAllocator>::EnsureArray
          (GrowingArray<Wasm::WasmTypes::WasmType,_Memory::ArenaAllocator> *this)

{
  Type pAVar1;
  uint32 uVar2;
  ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL> *pAVar3;
  WasmType *pWVar4;
  ArenaAllocator *allocator;
  long *plVar5;
  offset_in_ArenaAllocator_to_subr AllocFunc;
  offset_in_ArenaAllocator_to_subr AllocFunc_00;
  long extraout_RDX;
  code *local_f0;
  size_t lengthByteSize;
  TrackAllocData local_80;
  WasmType *local_58;
  TValue *newbuffer;
  ArenaAllocator *pAStack_48;
  uint32 newLength;
  TrackAllocData local_38;
  GrowingArray<Wasm::WasmTypes::WasmType,_Memory::ArenaAllocator> *local_10;
  GrowingArray<Wasm::WasmTypes::WasmType,_Memory::ArenaAllocator> *this_local;
  
  local_10 = this;
  if (this->buffer == (Type)0x0) {
    pAVar3 = &this->alloc->super_ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL>;
    Memory::TrackAllocData::CreateTrackAllocData
              (&local_38,(type_info *)&Wasm::WasmTypes::WasmType::typeinfo,0,(ulong)this->length,
               "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/DataStructures/GrowingArray.h"
               ,0x62);
    pAVar3 = Memory::ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL>::
             TrackAllocInfo(pAVar3,&local_38);
    pAStack_48 = (ArenaAllocator *)
                 Memory::TypeAllocatorFunc<Memory::ArenaAllocator,_Wasm::WasmTypes::WasmType>::
                 GetAllocFunc();
    pWVar4 = Memory::AllocateArray<Memory::ArenaAllocator,Wasm::WasmTypes::WasmType,false>
                       ((Memory *)pAVar3,pAStack_48,AllocFunc,(ulong)this->length);
    this->buffer = pWVar4;
    this->count = 0;
  }
  else if (this->count == this->length) {
    newbuffer._4_4_ = UInt32Math::AddMul<1u,2u>(this->length);
    pAVar3 = &this->alloc->super_ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL>;
    Memory::TrackAllocData::CreateTrackAllocData
              (&local_80,(type_info *)&Wasm::WasmTypes::WasmType::typeinfo,0,(ulong)newbuffer._4_4_,
               "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/DataStructures/GrowingArray.h"
               ,0x6b);
    pAVar3 = Memory::ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL>::
             TrackAllocInfo(pAVar3,&local_80);
    allocator = (ArenaAllocator *)
                Memory::TypeAllocatorFunc<Memory::ArenaAllocator,_Wasm::WasmTypes::WasmType>::
                GetAllocFunc();
    local_58 = Memory::AllocateArray<Memory::ArenaAllocator,Wasm::WasmTypes::WasmType,false>
                         ((Memory *)pAVar3,allocator,AllocFunc_00,(ulong)newbuffer._4_4_);
    Memory::CopyArray<Wasm::WasmTypes::WasmType,Wasm::WasmTypes::WasmType,Memory::ArenaAllocator>
              (local_58,(ulong)newbuffer._4_4_,this->buffer,(ulong)this->length);
    if (this->length != 0) {
      uVar2 = UInt32Math::Mul(this->length,4);
      pAVar1 = this->alloc;
      local_f0 = (code *)Memory::TypeAllocatorFunc<Memory::ArenaAllocator,_int>::GetFreeFunc();
      plVar5 = (long *)((long)&(pAVar1->
                               super_ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL>
                               ).super_Allocator.outOfMemoryFunc + extraout_RDX);
      if (((ulong)local_f0 & 1) != 0) {
        local_f0 = *(code **)(local_f0 + *plVar5 + -1);
      }
      (*local_f0)(plVar5,this->buffer,uVar2);
    }
    this->length = newbuffer._4_4_;
    this->buffer = local_58;
  }
  return;
}

Assistant:

void EnsureArray()
        {
            if (buffer == nullptr)
            {
                buffer = AllocateArray<AllocatorType, TValue, false>(
                    TRACK_ALLOC_INFO(alloc, TValue, AllocatorType, 0, length),
                    TypeAllocatorFunc<TAllocator, TValue>::GetAllocFunc(),
                    length);
                count = 0;
            }
            else if (count == length)
            {
                uint32 newLength = UInt32Math::AddMul<1, 2>(length);
                TValue * newbuffer = AllocateArray<AllocatorType, TValue, false>(
                    TRACK_ALLOC_INFO(alloc, TValue, AllocatorType, 0, newLength),
                    TypeAllocatorFunc<TAllocator, TValue>::GetAllocFunc(),
                    newLength);
                CopyArray<TValue, TValue, TAllocator>(newbuffer, newLength, buffer, length);
#ifdef DIAG_MEM
                listFreeAmount += length;
#endif
                if (length != 0)
                {
                    const size_t lengthByteSize = UInt32Math::Mul(length, sizeof(TValue));
                    AllocatorFree(alloc, (TypeAllocatorFunc<TAllocator, int>::GetFreeFunc()), buffer, lengthByteSize);
                }
                length = newLength;
                buffer = newbuffer;
            }
        }